

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderConfig.cpp
# Opt level: O0

void glu::parseRenderConfig(RenderConfig *config,CommandLine *cmdLine)

{
  CommandLine *config_00;
  SurfaceType SVar1;
  _Rb_tree_color _Var2;
  int iVar3;
  InternalError *this;
  char *pcVar4;
  allocator<char> local_39;
  string local_38;
  CommandLine *local_18;
  CommandLine *cmdLine_local;
  RenderConfig *config_local;
  
  local_18 = cmdLine;
  cmdLine_local = (CommandLine *)config;
  SVar1 = tcu::CommandLine::getSurfaceType(cmdLine);
  switch(SVar1) {
  case SURFACETYPE_WINDOW:
    *(undefined4 *)&(cmdLine_local->m_cmdLine).m_options.m_fields._M_t._M_impl.field_0x4 = 1;
    break;
  case SURFACETYPE_OFFSCREEN_NATIVE:
    *(undefined4 *)&(cmdLine_local->m_cmdLine).m_options.m_fields._M_t._M_impl.field_0x4 = 2;
    break;
  case SURFACETYPE_OFFSCREEN_GENERIC:
    *(undefined4 *)&(cmdLine_local->m_cmdLine).m_options.m_fields._M_t._M_impl.field_0x4 = 3;
    break;
  case SURFACETYPE_FBO:
    *(undefined4 *)&(cmdLine_local->m_cmdLine).m_options.m_fields._M_t._M_impl.field_0x4 = 0;
    break;
  case SURFACETYPE_LAST:
    *(undefined4 *)&(cmdLine_local->m_cmdLine).m_options.m_fields._M_t._M_impl.field_0x4 = 0;
    break;
  default:
    this = (InternalError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Unsupported surface type",&local_39);
    tcu::InternalError::InternalError(this,&local_38);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
  }
  _Var2 = parseWindowVisibility(local_18);
  (cmdLine_local->m_cmdLine).m_options.m_fields._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _Var2;
  iVar3 = tcu::CommandLine::getSurfaceWidth(local_18);
  if (0 < iVar3) {
    iVar3 = tcu::CommandLine::getSurfaceWidth(local_18);
    *(int *)((long)&cmdLine_local->_vptr_CommandLine + 4) = iVar3;
  }
  iVar3 = tcu::CommandLine::getSurfaceHeight(local_18);
  if (0 < iVar3) {
    iVar3 = tcu::CommandLine::getSurfaceHeight(local_18);
    *(int *)&(cmdLine_local->m_cmdLine).m_options.m_fields._M_t._M_impl = iVar3;
  }
  pcVar4 = tcu::CommandLine::getGLConfigName(local_18);
  config_00 = cmdLine_local;
  if (pcVar4 != (char *)0x0) {
    pcVar4 = tcu::CommandLine::getGLConfigName(local_18);
    parseConfigBitsFromName((RenderConfig *)config_00,pcVar4);
  }
  iVar3 = tcu::CommandLine::getGLConfigId(local_18);
  if (-1 < iVar3) {
    iVar3 = tcu::CommandLine::getGLConfigId(local_18);
    *(int *)((long)&(cmdLine_local->m_cmdLine).m_options.m_fields._M_t._M_impl.super__Rb_tree_header
                    ._M_header + 4) = iVar3;
  }
  return;
}

Assistant:

void parseRenderConfig (RenderConfig* config, const tcu::CommandLine& cmdLine)
{
	switch (cmdLine.getSurfaceType())
	{
		case tcu::SURFACETYPE_WINDOW:				config->surfaceType		= RenderConfig::SURFACETYPE_WINDOW;				break;
		case tcu::SURFACETYPE_OFFSCREEN_NATIVE:		config->surfaceType		= RenderConfig::SURFACETYPE_OFFSCREEN_NATIVE;	break;
		case tcu::SURFACETYPE_OFFSCREEN_GENERIC:	config->surfaceType		= RenderConfig::SURFACETYPE_OFFSCREEN_GENERIC;	break;
		case tcu::SURFACETYPE_FBO:					config->surfaceType		= RenderConfig::SURFACETYPE_DONT_CARE;			break;
		case tcu::SURFACETYPE_LAST:					config->surfaceType		= RenderConfig::SURFACETYPE_DONT_CARE;			break;
		default:
			throw tcu::InternalError("Unsupported surface type");
	}

	config->windowVisibility = parseWindowVisibility(cmdLine);

	if (cmdLine.getSurfaceWidth() > 0)
		config->width = cmdLine.getSurfaceWidth();

	if (cmdLine.getSurfaceHeight() > 0)
		config->height = cmdLine.getSurfaceHeight();

	if (cmdLine.getGLConfigName() != DE_NULL)
		parseConfigBitsFromName(config, cmdLine.getGLConfigName());

	if (cmdLine.getGLConfigId() >= 0)
		config->id = cmdLine.getGLConfigId();
}